

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall Am_Depends_Iterator::Next(Am_Depends_Iterator *this)

{
  Am_Slot_Data *pAVar1;
  bool bVar2;
  Am_Depends_Iterator *this_local;
  
  if (this->current == (Am_Dependency_Data *)0x0) {
    if (this->context != (Am_Formula_Advanced *)0x0) {
      this->current =
           (Am_Dependency_Data *)
           this->context[4].super_Am_Constraint.super_Am_Registered_Type._vptr_Am_Registered_Type;
    }
  }
  else {
    this->current = *(Am_Dependency_Data **)(this->current + 0x10);
  }
  while( true ) {
    bVar2 = false;
    if (this->current != (Am_Dependency_Data *)0x0) {
      pAVar1 = Am_Slot::operator_cast_to_Am_Slot_Data_((Am_Slot *)this->current);
      bVar2 = pAVar1 == (Am_Slot_Data *)0x0;
    }
    if (!bVar2) break;
    this->current = *(Am_Dependency_Data **)(this->current + 0x10);
  }
  return;
}

Assistant:

void
Am_Depends_Iterator::Next()
{
  if (current)
    current = (Am_Dependency_Data *)((Dependency *)current)->next;
  else if (context)
    current = (Am_Dependency_Data *)((Formula_Constraint *)context)->depends_on;
  while (current && !(((Dependency *)current)->depended))
    current = (Am_Dependency_Data *)((Dependency *)current)->next;
}